

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

void Ppmd8_Update2(CPpmd8 *p)

{
  UInt16 *pUVar1;
  byte bVar2;
  
  pUVar1 = &p->MinContext->SummFreq;
  *pUVar1 = *pUVar1 + 4;
  bVar2 = p->FoundState->Freq + 4;
  p->FoundState->Freq = bVar2;
  if (0x7c < bVar2) {
    Rescale(p);
  }
  p->RunLength = p->InitRL;
  UpdateModel(p);
  p->MinContext = p->MaxContext;
  return;
}

Assistant:

void Ppmd8_Update2(CPpmd8 *p)
{
  p->MinContext->SummFreq += 4;
  if ((p->FoundState->Freq += 4) > MAX_FREQ)
    Rescale(p);
  p->RunLength = p->InitRL;
  UpdateModel(p);
  p->MinContext = p->MaxContext;
}